

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry.h
# Opt level: O1

void __thiscall
google::protobuf::internal::
MapEntry<unsigned_int,_google::protobuf::Message,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::~MapEntry(MapEntry<unsigned_int,_google::protobuf::Message,_(google::protobuf::internal::WireFormatLite::FieldType)7,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            *this)

{
  ulong uVar1;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__MapEntry_0195c778;
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    SharedDtor((MessageLite *)this);
  }
  return;
}

Assistant:

~MapEntry() PROTOBUF_OVERRIDE {
    // Make sure that `Value` is never a derived message type.
    // We don't want to instantiate the template with every unique derived type.
    // The assertion is in the destructor because we need `Value` to be
    // complete to test it.
    static_assert(!std::is_base_of<Message, Value>::value ||
                      std::is_same<Message, Value>::value,
                  "");

    if (GetArena() != nullptr) return;
    SharedDtor(*this);
  }